

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

bool AreMembersAligned(ExternTypeInfo *lType,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  TypeCategory TVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar4 = (ulong)(lType->field_8).arrSize;
  if (uVar4 == 0) {
    bVar3 = true;
  }
  else {
    uVar5 = (lType->field_11).subType;
    bVar3 = true;
    do {
      uVar1 = exTypeExtra[uVar5].offset;
      TVar2 = exTypes[exTypeExtra[uVar5].type].type;
      if (TVar2 == TYPE_SHORT) {
        bVar6 = (uVar1 & 1) == 0;
LAB_002408da:
        bVar3 = (bool)(bVar3 & bVar6);
      }
      else {
        if (TVar2 == TYPE_LONG) {
          bVar6 = (uVar1 & 7) == 0;
          goto LAB_002408da;
        }
        if (TVar2 == TYPE_INT) {
          bVar6 = (uVar1 & 3) == 0;
          goto LAB_002408da;
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return bVar3;
}

Assistant:

bool AreMembersAligned(ExternTypeInfo *lType, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	bool aligned = 1;
	for(unsigned m = 0; m < lType->memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[lType->memberOffset + m];
		ExternTypeInfo &memberType = exTypes[member.type];
		unsigned pos = member.offset;

		switch(memberType.type)
		{
		case ExternTypeInfo::TYPE_COMPLEX:
			break;
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_INT:
			if(pos % 4 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			break;
		case ExternTypeInfo::TYPE_LONG:
			if(pos % 8 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			break;
		case ExternTypeInfo::TYPE_SHORT:
			if(pos % 2 != 0)
				aligned = 0;
			break;
		case ExternTypeInfo::TYPE_CHAR:
			break;
		}
		pos += memberType.size;
	}
	//printf("%s\n", aligned ? "aligned" : "unaligned");
	return aligned;
}